

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parseurlandfillconn(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  unsigned_short uVar2;
  uint uVar3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  unsigned_long scope;
  char *endp;
  size_t hlen;
  char *zoneid;
  unsigned_long port;
  char *url;
  char *hostname;
  CURLU *pCStack_30;
  CURLUcode uc;
  CURLU *uh;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  up_free(data);
  if (*(long *)conn_local[2].sock == 0) {
    pCStack_30 = curl_url();
    conn_local[3].send[1] = (Curl_send *)pCStack_30;
  }
  else {
    pCStack_30 = curl_url_dup(*(CURLU **)conn_local[2].sock);
    conn_local[3].send[1] = (Curl_send *)pCStack_30;
  }
  if (pCStack_30 == (CURLU *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((*(long *)&conn_local[1].negnpn != 0) &&
       (_Var1 = Curl_is_absolute_url((char *)conn_local[2].recv[1],(char *)0x0,0x28), !_Var1)) {
      if (((ulong)conn_local[2].ssl[0].backend & 1) != 0) {
        (*Curl_cfree)(conn_local[2].recv[1]);
      }
      port = (unsigned_long)
             curl_maprintf("%s://%s",*(undefined8 *)&conn_local[1].negnpn,conn_local[2].recv[1]);
      if ((Curl_recv *)port == (Curl_recv *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      conn_local[2].recv[1] = (Curl_recv *)port;
      *(byte *)&conn_local[2].ssl[0].backend = *(byte *)&conn_local[2].ssl[0].backend & 0xfe | 1;
    }
    if (*(long *)conn_local[2].sock == 0) {
      uVar8 = 0;
      if (((uint)((ulong)conn_local[2].recv[0] >> 0x36) & 1) != 0) {
        uVar8 = 0x20;
      }
      uVar3 = 0;
      if (((uint)((ulong)conn_local[2].recv[0] >> 0x2f) & 1) != 0) {
        uVar3 = 0x10;
      }
      hostname._4_4_ =
           curl_url_set(pCStack_30,CURLUPART_URL,(char *)conn_local[2].recv[1],uVar8 | 0x208 | uVar3
                       );
      if (hostname._4_4_ != CURLUE_OK) {
        CVar4 = Curl_uc_to_curlcode(hostname._4_4_);
        return CVar4;
      }
      hostname._4_4_ = 0;
    }
    hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_SCHEME,(char **)conn_local[3].ssl,0);
    if (hostname._4_4_ == CURLUE_OK) {
      uh._4_4_ = findprotocol((Curl_easy *)conn_local,pcStack_20,*(char **)conn_local[3].ssl);
      data_local._4_4_ = uh._4_4_;
      if (uh._4_4_ == CURLE_OK) {
        hostname._4_4_ =
             curl_url_get(pCStack_30,CURLUPART_USER,(char **)(conn_local[3].ssl + 1),0x40);
        if (hostname._4_4_ == CURLUE_OK) {
          pcVar6 = (*Curl_cstrdup)(*(char **)(conn_local[3].ssl + 1));
          pcStack_20->user = pcVar6;
          if (pcStack_20->user == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          *(uint *)&(pcStack_20->bits).field_0x4 =
               *(uint *)&(pcStack_20->bits).field_0x4 & 0xffffff7f | 0x80;
        }
        else if (hostname._4_4_ != CURLUE_NO_USER) {
          CVar4 = Curl_uc_to_curlcode(hostname._4_4_);
          return CVar4;
        }
        hostname._4_4_ =
             curl_url_get(pCStack_30,CURLUPART_PASSWORD,(char **)&conn_local[3].ssl[1].backend,0x40)
        ;
        if (hostname._4_4_ == CURLUE_OK) {
          pcVar6 = (*Curl_cstrdup)((char *)conn_local[3].ssl[1].backend);
          pcStack_20->passwd = pcVar6;
          if (pcStack_20->passwd == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          *(uint *)&(pcStack_20->bits).field_0x4 =
               *(uint *)&(pcStack_20->bits).field_0x4 & 0xffffff7f | 0x80;
        }
        else if (hostname._4_4_ != CURLUE_NO_PASSWORD) {
          CVar4 = Curl_uc_to_curlcode(hostname._4_4_);
          return CVar4;
        }
        hostname._4_4_ =
             curl_url_get(pCStack_30,CURLUPART_OPTIONS,(char **)&conn_local[3].ssl[1].field_0x10,
                          0x40);
        if (hostname._4_4_ == CURLUE_OK) {
          pcVar6 = (*Curl_cstrdup)(*(char **)&conn_local[3].ssl[1].field_0x10);
          pcStack_20->options = pcVar6;
          if (pcStack_20->options == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        else if (hostname._4_4_ != CURLUE_NO_OPTIONS) {
          CVar4 = Curl_uc_to_curlcode(hostname._4_4_);
          return CVar4;
        }
        hostname._4_4_ =
             curl_url_get(pCStack_30,CURLUPART_HOST,(char **)&conn_local[3].ssl[0].backend,0);
        if ((hostname._4_4_ == CURLUE_OK) ||
           (iVar5 = Curl_strcasecompare("file",*(char **)conn_local[3].ssl), iVar5 != 0)) {
          hostname._4_4_ =
               curl_url_get(pCStack_30,CURLUPART_PATH,(char **)conn_local[3].proxy_ssl,0);
          if (hostname._4_4_ == CURLUE_OK) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_PORT,(char **)&conn_local[3].ssl[0].field_0x10,1)
            ;
            if (hostname._4_4_ == CURLUE_OK) {
              zoneid = (char *)strtoul(*(char **)&conn_local[3].ssl[0].field_0x10,(char **)0x0,10);
              uVar2 = curlx_ultous((unsigned_long)zoneid);
              pcStack_20->remote_port = (uint)uVar2;
            }
            else {
              iVar5 = Curl_strcasecompare("file",*(char **)conn_local[3].ssl);
              if (iVar5 == 0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            curl_url_get(pCStack_30,CURLUPART_QUERY,(char **)&conn_local[3].proxy_ssl[0].backend,0);
            url = (char *)conn_local[3].ssl[0].backend;
            if ((ssl_backend_data *)url == (ssl_backend_data *)0x0) {
              url = "";
            }
            if (*url == '[') {
              hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_ZONEID,(char **)&hlen,0);
              *(uint *)&(pcStack_20->bits).field_0x4 =
                   *(uint *)&(pcStack_20->bits).field_0x4 & 0xfffffdff | 0x200;
              url = url + 1;
              endp = (char *)strlen(url);
              url[(long)(endp + -1)] = '\0';
              if ((hostname._4_4_ == CURLUE_OK) && (hlen != 0)) {
                uVar7 = strtoul((char *)hlen,(char **)&scope,10);
                if ((*(char *)scope == '\0') && (uVar7 < 0xffffffff)) {
                  pcStack_20->scope_id = (uint)uVar7;
                }
                (*Curl_cfree)((void *)hlen);
              }
            }
            pcVar6 = (*Curl_cstrdup)(url);
            (pcStack_20->host).rawalloc = pcVar6;
            if ((pcStack_20->host).rawalloc == (char *)0x0) {
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              (pcStack_20->host).name = (pcStack_20->host).rawalloc;
              if (*(int *)(conn_local[2].primary_ip + 0xe) != 0) {
                pcStack_20->scope_id = *(uint *)(conn_local[2].primary_ip + 0xe);
              }
              data_local._4_4_ = CURLE_OK;
            }
          }
          else {
            data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
          }
        }
        else {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
      }
    }
    else {
      data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode parseurlandfillconn(struct Curl_easy *data,
                                    struct connectdata *conn)
{
  CURLcode result;
  CURLU *uh;
  CURLUcode uc;
  char *hostname;

  up_free(data); /* cleanup previous leftovers first */

  /* parse the URL */
  if(data->set.uh) {
    uh = data->state.uh = curl_url_dup(data->set.uh);
  }
  else {
    uh = data->state.uh = curl_url();
  }

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  if(data->set.str[STRING_DEFAULT_PROTOCOL] &&
     !Curl_is_absolute_url(data->change.url, NULL, MAX_SCHEME_LEN)) {
    char *url;
    if(data->change.url_alloc)
      free(data->change.url);
    url = aprintf("%s://%s", data->set.str[STRING_DEFAULT_PROTOCOL],
                  data->change.url);
    if(!url)
      return CURLE_OUT_OF_MEMORY;
    data->change.url = url;
    data->change.url_alloc = TRUE;
  }

  if(!data->set.uh) {
    uc = curl_url_set(uh, CURLUPART_URL, data->change.url,
                    CURLU_GUESS_SCHEME |
                    CURLU_NON_SUPPORT_SCHEME |
                    (data->set.disallow_username_in_url ?
                     CURLU_DISALLOW_USER : 0) |
                    (data->set.path_as_is ? CURLU_PATH_AS_IS : 0));
    if(uc) {
      DEBUGF(infof(data, "curl_url_set rejected %s\n", data->change.url));
      return Curl_uc_to_curlcode(uc);
    }
  }

  uc = curl_url_get(uh, CURLUPART_SCHEME, &data->state.up.scheme, 0);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  result = findprotocol(data, conn, data->state.up.scheme);
  if(result)
    return result;

  uc = curl_url_get(uh, CURLUPART_USER, &data->state.up.user,
                    CURLU_URLDECODE);
  if(!uc) {
    conn->user = strdup(data->state.up.user);
    if(!conn->user)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE;
  }
  else if(uc != CURLUE_NO_USER)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PASSWORD, &data->state.up.password,
                    CURLU_URLDECODE);
  if(!uc) {
    conn->passwd = strdup(data->state.up.password);
    if(!conn->passwd)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE;
  }
  else if(uc != CURLUE_NO_PASSWORD)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_OPTIONS, &data->state.up.options,
                    CURLU_URLDECODE);
  if(!uc) {
    conn->options = strdup(data->state.up.options);
    if(!conn->options)
      return CURLE_OUT_OF_MEMORY;
  }
  else if(uc != CURLUE_NO_OPTIONS)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_HOST, &data->state.up.hostname, 0);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }

  uc = curl_url_get(uh, CURLUPART_PATH, &data->state.up.path, 0);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PORT, &data->state.up.port,
                    CURLU_DEFAULT_PORT);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    unsigned long port = strtoul(data->state.up.port, NULL, 10);
    conn->remote_port = curlx_ultous(port);
  }

  (void)curl_url_get(uh, CURLUPART_QUERY, &data->state.up.query, 0);

  hostname = data->state.up.hostname;
  if(!hostname)
    /* this is for file:// transfers, get a dummy made */
    hostname = (char *)"";

  if(hostname[0] == '[') {
    /* This looks like an IPv6 address literal. See if there is an address
       scope. */
    char *zoneid;
    size_t hlen;
    uc = curl_url_get(uh, CURLUPART_ZONEID, &zoneid, 0);
    conn->bits.ipv6_ip = TRUE;

    /* cut off the brackets! */
    hostname++;
    hlen = strlen(hostname);
    hostname[hlen - 1] = 0;
    if(!uc && zoneid) {
      char *endp;
      unsigned long scope;
      scope = strtoul(zoneid, &endp, 10);
      if(!*endp && (scope < UINT_MAX)) {
        /* A plain number, use it direcly as a scope id. */
        conn->scope_id = (unsigned int)scope;
      }
#ifdef HAVE_IF_NAMETOINDEX
      else {
        /* Zone identifier is not numeric */
        unsigned int scopeidx = 0;
        scopeidx = if_nametoindex(zoneid);
        if(!scopeidx)
          infof(data, "Invalid zoneid id: %s; %s\n", zoneid,
                strerror(errno));
        else
          conn->scope_id = scopeidx;

      }
#endif /* HAVE_IF_NAMETOINDEX */
      free(zoneid);
    }
  }

  /* make sure the connect struct gets its own copy of the host name */
  conn->host.rawalloc = strdup(hostname);
  if(!conn->host.rawalloc)
    return CURLE_OUT_OF_MEMORY;
  conn->host.name = conn->host.rawalloc;

  if(data->set.scope_id)
    /* Override any scope that was set above.  */
    conn->scope_id = data->set.scope_id;

  return CURLE_OK;
}